

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXingReader.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Type TVar1;
  BarcodeFormat BVar2;
  Result *pRVar3;
  pointer pbVar4;
  uint uVar5;
  bool bVar6;
  __type _Var7;
  char cVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  stbi_uc *data;
  reference pvVar12;
  long *plVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  int *piVar14;
  long lVar15;
  long lVar16;
  ostream *poVar17;
  ulong uVar18;
  ByteArray *extraout_RDX;
  ByteArray *extraout_RDX_00;
  ByteArray *bytes;
  string *v;
  string *v_00;
  string *v_01;
  string *v_02;
  string *v_03;
  string *v_04;
  string *v_05;
  string *v_06;
  int iVar19;
  Result *this;
  char *pcVar20;
  int iVar21;
  pointer __lhs;
  int iVar22;
  long in_FS_OFFSET;
  uint local_23c;
  anon_class_16_2_fc49f3d4 is;
  int channels;
  undefined1 local_200 [32];
  Barcodes barcodes;
  int height;
  int width;
  CLI cli;
  int local_158 [8];
  Barcodes allBarcodes;
  unique_ptr<unsigned_char,_void_(*)(void_*)> buffer;
  ImageView image;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  array<ZXing::ImageFormat,_5UL> ImageFormatFromChannels;
  allocator<char> local_a8 [32];
  string local_88;
  string local_68 [56];
  
  cli.filePaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cli.filePaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cli.filePaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cli.outPath._M_dataplus._M_p = (pointer)&cli.outPath.field_2;
  cli.outPath._M_string_length = 0;
  cli.outPath.field_2._M_local_buf[0] = '\0';
  cli.forceChannels = 0;
  cli.rotate = 0;
  cli.oneLine = false;
  cli.bytesOnly = false;
  cli.showSymbol = false;
  allBarcodes.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = 0x82d2f;
  allBarcodes.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  allBarcodes.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar21 = 1;
  local_200._0_8_ = argv;
  while (pbVar4 = cli.filePaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, local_158[0] = iVar21, iVar21 < argc)
  {
    is.argv = (char ***)local_200;
    is.i = local_158;
    bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"-fast");
    if (bVar6) {
      uVar9 = uVar9 & 0xfffffffe;
    }
    else {
      bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"-norotate");
      if (bVar6) {
        uVar9 = uVar9 & 0xfffffffd;
      }
      else {
        bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"-noinvert");
        if (bVar6) {
          uVar9 = uVar9 & 0xfffffffb;
        }
        else {
          bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"-noscale");
          if (bVar6) {
            uVar9 = uVar9 & 0xfffffff7;
          }
          else {
            bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"-single");
            if (((!bVar6) &&
                (bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"-ispure"), !bVar6))
               && (bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"-errors"), !bVar6
                  )) {
              bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"-format");
              if (bVar6) {
                local_158[0] = iVar21 + 1;
                if (local_158[0] == argc) goto LAB_0010b306;
                pcVar20 = *(char **)(local_200._0_8_ + (long)local_158[0] * 8);
                sVar11 = strlen(pcVar20);
                ZXing::BarcodeFormatsFromString(sVar11,pcVar20);
              }
              else {
                bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"-binarizer");
                if (bVar6) {
                  local_158[0] = iVar21 + 1;
                  if ((local_158[0] == argc) ||
                     (((bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"local"),
                       !bVar6 && (bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                    (&is,"global"), !bVar6)) &&
                      (bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"fixed"),
                      !bVar6)))) goto LAB_0010b306;
                }
                else {
                  bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"-mode");
                  if (bVar6) {
                    local_158[0] = iVar21 + 1;
                    if (local_158[0] == argc) goto LAB_0010b306;
                    bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"plain");
                    if (bVar6) {
                      uVar9 = 0;
                    }
                    else {
                      bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"eci");
                      if (bVar6) {
                        uVar9 = 0x40000;
                      }
                      else {
                        bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"hri");
                        if (bVar6) {
                          uVar9 = 0x80000;
                        }
                        else {
                          bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"escaped");
                          if (!bVar6) goto LAB_0010b306;
                          uVar9 = 0x100000;
                        }
                      }
                    }
                  }
                  else {
                    bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"-1");
                    if (bVar6) {
                      cli.oneLine = true;
                    }
                    else {
                      bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"-bytes");
                      if (bVar6) {
                        cli.bytesOnly = true;
                      }
                      else {
                        bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"-symbol");
                        if (bVar6) {
                          cli.showSymbol = true;
                        }
                        else {
                          bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()(&is,"-pngout");
                          if (bVar6) {
                            local_158[0] = iVar21 + 1;
                            if (local_158[0] == argc) goto LAB_0010b306;
                            std::__cxx11::string::assign((char *)&cli.outPath);
                          }
                          else {
                            bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                              (&is,"-channels");
                            if (bVar6) {
                              local_158[0] = iVar21 + 1;
                              if (local_158[0] == argc) goto LAB_0010b306;
                              cli.forceChannels =
                                   atoi(*(char **)(local_200._0_8_ + (long)local_158[0] * 8));
                            }
                            else {
                              bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                (&is,"-rotate");
                              if (bVar6) {
                                local_158[0] = iVar21 + 1;
                                if (local_158[0] == argc) goto LAB_0010b306;
                                cli.rotate = atoi(*(char **)(local_200._0_8_ +
                                                            (long)local_158[0] * 8));
                              }
                              else {
                                bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                  (&is,"-help");
                                if ((bVar6) ||
                                   (bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                      (&is,"--help"), bVar6)) {
                                  PrintUsage(*(char **)local_200._0_8_);
LAB_0010b2a0:
                                  exit(0);
                                }
                                bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                  (&is,"-version");
                                if ((bVar6) ||
                                   (bVar6 = ParseOptions::anon_class_16_2_fc49f3d4::operator()
                                                      (&is,"--version"), bVar6)) {
                                  poVar17 = std::operator<<((ostream *)&std::cout,"ZXingReader ");
                                  poVar17 = std::operator<<(poVar17,"2.2.1");
                                  std::operator<<(poVar17,"\n");
                                  goto LAB_0010b2a0;
                                }
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&image,
                                           *(char **)(local_200._0_8_ + (long)iVar21 * 8),local_a8);
                                std::
                                vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                                emplace_back<std::__cxx11::string>
                                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                            *)&cli,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&image);
                                std::__cxx11::string::~string((string *)&image);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    iVar21 = local_158[0] + 1;
  }
  if (cli.filePaths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      cli.filePaths.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0010b306:
    PrintUsage(*argv);
    uVar5 = 0xffffffff;
  }
  else {
    *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) | 1;
    uVar10 = 0;
    local_23c = 0;
    __lhs = cli.filePaths.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar5 = uVar10;
      if (__lhs == pbVar4) break;
      data = stbi_load((__lhs->_M_dataplus)._M_p,&width,&height,&channels,cli.forceChannels);
      iVar19 = width;
      iVar21 = height;
      buffer._M_t.super___uniq_ptr_impl<unsigned_char,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_void_(*)(void_*)>.
      super__Tuple_impl<1UL,_void_(*)(void_*)>.super__Head_base<1UL,_void_(*)(void_*),_false>.
      _M_head_impl = (_Head_base<1UL,_void_(*)(void_*),_false>)stbi_image_free;
      buffer._M_t.super___uniq_ptr_impl<unsigned_char,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = data;
      if (data == (stbi_uc *)0x0) {
        poVar17 = std::operator<<((ostream *)&std::cerr,"Failed to read image: ");
        poVar17 = std::operator<<(poVar17,(string *)__lhs);
        poVar17 = std::operator<<(poVar17," (");
        poVar17 = std::operator<<(poVar17,*(char **)(in_FS_OFFSET + -0x20));
        poVar17 = std::operator<<(poVar17,")");
        std::operator<<(poVar17,"\n");
        local_23c = 0xffffffff;
      }
      else {
        iVar22 = cli.forceChannels;
        if (cli.forceChannels == 0) {
          iVar22 = channels;
        }
        ImageFormatFromChannels._M_elems[0] = None;
        ImageFormatFromChannels._M_elems[1] = Lum;
        ImageFormatFromChannels._M_elems[2] = LumA;
        ImageFormatFromChannels._M_elems[3] = RGB;
        ImageFormatFromChannels._M_elems[4] = RGBA;
        channels = iVar22;
        pvVar12 = std::array<ZXing::ImageFormat,_5UL>::at(&ImageFormatFromChannels,(long)iVar22);
        ZXing::ImageView::ImageView(&image,data,iVar19,iVar21,*pvVar12,0,0);
        ZXing::ImageView::rotated((ImageView *)&is,&image,cli.rotate);
        ZXing::ReadBarcodes((ImageView *)&barcodes,(ReaderOptions *)&is);
        if (barcodes.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>._M_impl.
            super__Vector_impl_data._M_start ==
            barcodes.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::emplace_back<>(&barcodes);
        }
        std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
        insert<__gnu_cxx::__normal_iterator<ZXing::Result*,std::vector<ZXing::Result,std::allocator<ZXing::Result>>>,void>
                  ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)&allBarcodes,
                   (const_iterator)
                   allBarcodes.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
                    )barcodes.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>
                    )barcodes.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        _Var7 = std::operator==(__lhs,cli.filePaths.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + -1);
        this = barcodes.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>._M_impl.
               super__Vector_impl_data._M_start;
        pRVar3 = barcodes.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (_Var7) {
          ZXing::MergeStructuredAppendSequences((vector *)&is);
          std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
          insert<std::move_iterator<__gnu_cxx::__normal_iterator<ZXing::Result*,std::vector<ZXing::Result,std::allocator<ZXing::Result>>>>,void>
                    ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)&barcodes,
                     (const_iterator)
                     barcodes.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (move_iterator<__gnu_cxx::__normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>_>
                      )is.argv,
                     (move_iterator<__gnu_cxx::__normal_iterator<ZXing::Result_*,_std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>_>_>
                      )is.i);
          std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                    ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)&is);
          this = barcodes.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>._M_impl.
                 super__Vector_impl_data._M_start;
          pRVar3 = barcodes.super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        for (; this != pRVar3; this = this + 1) {
          if (cli.outPath._M_string_length != 0) {
            drawRect(&image,&this->_position,(this->_error)._type != None);
          }
          TVar1 = (this->_error)._type;
          if (cli.bytesOnly == true) {
            plVar13 = (long *)ZXing::Result::bytes();
            lVar15 = *plVar13;
            ZXing::Result::bytes();
            std::ostream::write((char *)&std::cout,lVar15);
          }
          else {
            if (cli.oneLine == true) {
              poVar17 = std::operator<<((ostream *)&std::cout,(string *)__lhs);
              poVar17 = std::operator<<(poVar17," ");
              ZXing::ToString_abi_cxx11_((BarcodeFormat)&is);
              std::operator<<(poVar17,(string *)&is);
              std::__cxx11::string::~string((string *)&is);
              cVar8 = ZXing::Result::isValid();
              if (cVar8 == '\0') {
                pcVar20 = "\n";
                if ((this->_error)._type == None) goto LAB_0010aafd;
                poVar17 = std::operator<<((ostream *)&std::cout," ");
                ZXing::ToString_abi_cxx11_((Error *)&is);
                std::operator<<(poVar17,(string *)&is);
              }
              else {
                poVar17 = std::operator<<((ostream *)&std::cout," \"");
                ZXing::Result::text_abi_cxx11_((TextMode)&is);
                poVar17 = std::operator<<(poVar17,(string *)&is);
                std::operator<<(poVar17,"\"");
              }
              std::__cxx11::string::~string((string *)&is);
              pcVar20 = "\n";
            }
            else {
              uVar18 = (long)cli.filePaths.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)cli.filePaths.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              if ((0x20 < uVar18) ||
                 (1 < (ulong)(((long)barcodes.
                                     super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)barcodes.
                                    super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0xd8))) {
                if (main::firstFile == '\x01') {
                  std::operator<<((ostream *)&std::cout,"\n");
                  uVar18 = (long)cli.filePaths.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)cli.filePaths.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                }
                if (0x20 < uVar18) {
                  poVar17 = std::operator<<((ostream *)&std::cout,"File:       ");
                  poVar17 = std::operator<<(poVar17,(string *)__lhs);
                  std::operator<<(poVar17,"\n");
                }
                main::firstFile = '\x01';
              }
              pcVar20 = "No barcode found\n";
              if (this->_format != None) {
                poVar17 = std::operator<<((ostream *)&std::cout,"Text:       \"");
                ZXing::Result::text_abi_cxx11_();
                poVar17 = std::operator<<(poVar17,(string *)&is);
                poVar17 = std::operator<<(poVar17,"\"\n");
                poVar17 = std::operator<<(poVar17,"Bytes:      ");
                if ((uVar9 & 0x1c0000) == 0x40000) {
                  ZXing::Result::bytesECI();
                  bytes = extraout_RDX;
                }
                else {
                  __x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        ZXing::Result::bytes();
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e0,__x)
                  ;
                  bytes = extraout_RDX_00;
                }
                ZXing::ToHex_abi_cxx11_((string *)local_200,(ZXing *)&local_e0,bytes);
                poVar17 = std::operator<<(poVar17,(string *)local_200);
                poVar17 = std::operator<<(poVar17,"\n");
                poVar17 = std::operator<<(poVar17,"Format:     ");
                ZXing::ToString_abi_cxx11_((BarcodeFormat)(string *)local_158);
                poVar17 = std::operator<<(poVar17,(string *)local_158);
                poVar17 = std::operator<<(poVar17,"\n");
                poVar17 = std::operator<<(poVar17,"Identifier: ");
                ZXing::Result::symbologyIdentifier_abi_cxx11_();
                poVar17 = std::operator<<(poVar17,(string *)local_a8);
                poVar17 = std::operator<<(poVar17,"\n");
                poVar17 = std::operator<<(poVar17,"Content:    ");
                ZXing::Result::contentType();
                ZXing::ToString_abi_cxx11_((ContentType)local_68);
                poVar17 = std::operator<<(poVar17,local_68);
                poVar17 = std::operator<<(poVar17,"\n");
                poVar17 = std::operator<<(poVar17,"HasECI:     ");
                ZXing::Result::hasECI();
                poVar17 = std::ostream::_M_insert<bool>(SUB81(poVar17,0));
                poVar17 = std::operator<<(poVar17,"\n");
                poVar17 = std::operator<<(poVar17,"Position:   ");
                ZXing::ToString<int>(&local_88,&this->_position);
                poVar17 = std::operator<<(poVar17,(string *)&local_88);
                poVar17 = std::operator<<(poVar17,"\n");
                poVar17 = std::operator<<(poVar17,"Rotation:   ");
                iVar21 = ZXing::Result::orientation();
                poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar21);
                poVar17 = std::operator<<(poVar17," deg\n");
                poVar17 = std::operator<<(poVar17,"IsMirrored: ");
                poVar17 = std::ostream::_M_insert<bool>(SUB81(poVar17,0));
                poVar17 = std::operator<<(poVar17,"\n");
                poVar17 = std::operator<<(poVar17,"IsInverted: ");
                poVar17 = std::ostream::_M_insert<bool>(SUB81(poVar17,0));
                std::operator<<(poVar17,"\n");
                std::__cxx11::string::~string((string *)&local_88);
                std::__cxx11::string::~string(local_68);
                std::__cxx11::string::~string((string *)local_a8);
                std::__cxx11::string::~string((string *)local_158);
                std::__cxx11::string::~string((string *)local_200);
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          (&local_e0);
                std::__cxx11::string::~string((string *)&is);
                ZXing::Result::ecLevel_abi_cxx11_();
                main::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)"EC Level:   ",(char *)&is,v);
                std::__cxx11::string::~string((string *)&is);
                ZXing::Result::version_abi_cxx11_();
                main::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)"Version:    ",(char *)&is,v_00);
                std::__cxx11::string::~string((string *)&is);
                ZXing::ToString_abi_cxx11_((Error *)&is);
                main::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)"Error:      ",(char *)&is,v_01);
                std::__cxx11::string::~string((string *)&is);
                if (this->_lineCount != 0) {
                  poVar17 = std::operator<<((ostream *)&std::cout,"Lines:      ");
                  poVar17 = (ostream *)std::ostream::operator<<(poVar17,this->_lineCount);
                  std::operator<<(poVar17,"\n");
                }
                BVar2 = this->_format;
                if ((BVar2 & ~(UPCE|UPCA|EAN13|EAN8)) == None) {
                  if (BVar2 != None) {
                    ZXing::Result::text_abi_cxx11_();
                    ZXing::GTIN::LookupCountryIdentifier((string *)&is,(BarcodeFormat)local_200);
                    main::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)"Country:    ",(char *)&is,v_03);
                    std::__cxx11::string::~string((string *)&is);
                    std::__cxx11::string::~string((string *)local_200);
                    ZXing::GTIN::EanAddOn_abi_cxx11_((Result *)&is);
                    main::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)"Add-On:     ",(char *)&is,v_04);
                    std::__cxx11::string::~string((string *)&is);
                    ZXing::GTIN::EanAddOn_abi_cxx11_((Result *)local_200);
                    ZXing::GTIN::Price((string *)&is);
                    main::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)"Price:      ",(char *)&is,v_05);
                    std::__cxx11::string::~string((string *)&is);
                    std::__cxx11::string::~string((string *)local_200);
                    ZXing::GTIN::EanAddOn_abi_cxx11_((Result *)local_200);
                    ZXing::GTIN::IssueNr((string *)&is);
                    main::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)"Issue #:    ",(char *)&is,v_06);
                    goto LAB_0010af6c;
                  }
                }
                else if ((BVar2 == ITF) &&
                        (piVar14 = (int *)ZXing::Result::bytes(), piVar14[2] - *piVar14 == 0xe)) {
                  ZXing::Result::text_abi_cxx11_();
                  ZXing::GTIN::LookupCountryIdentifier((string *)&is,(BarcodeFormat)local_200);
                  main::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)"Country:    ",(char *)&is,v_02);
LAB_0010af6c:
                  std::__cxx11::string::~string((string *)&is);
                  std::__cxx11::string::~string((string *)local_200);
                }
                bVar6 = ZXing::Result::isPartOfSequence(this);
                if (bVar6) {
                  poVar17 = std::operator<<((ostream *)&std::cout,"Structured Append: symbol ");
                  iVar21 = ZXing::Result::sequenceIndex();
                  poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar21 + 1);
                  poVar17 = std::operator<<(poVar17," of ");
                  iVar21 = ZXing::Result::sequenceSize();
                  poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar21);
                  poVar17 = std::operator<<(poVar17," (parity/id: \'");
                  ZXing::Result::sequenceId_abi_cxx11_();
                  poVar17 = std::operator<<(poVar17,(string *)&is);
                  std::operator<<(poVar17,"\')\n");
LAB_0010b08a:
                  std::__cxx11::string::~string((string *)&is);
                }
                else {
                  iVar21 = ZXing::Result::sequenceSize();
                  if (0 < iVar21) {
                    poVar17 = std::operator<<((ostream *)&std::cout,
                                              "Structured Append: merged result from ");
                    iVar21 = ZXing::Result::sequenceSize();
                    poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar21);
                    poVar17 = std::operator<<(poVar17," symbols (parity/id: \'");
                    ZXing::Result::sequenceId_abi_cxx11_();
                    poVar17 = std::operator<<(poVar17,(string *)&is);
                    std::operator<<(poVar17,"\')\n");
                    goto LAB_0010b08a;
                  }
                }
                if (this->_readerInit == true) {
                  std::operator<<((ostream *)&std::cout,"Reader Initialisation/Programming\n");
                }
                goto LAB_0010ab09;
              }
            }
LAB_0010aafd:
            std::operator<<((ostream *)&std::cout,pcVar20);
          }
LAB_0010ab09:
          uVar10 = uVar10 | TVar1;
        }
        if ((((long)cli.filePaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)cli.filePaths.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0x1fffffffe0U) == 0x20) &&
           (cli.outPath._M_string_length != 0)) {
          stbi_write_png(cli.outPath._M_dataplus._M_p,image._width,image._height,3,image._data,
                         image._rowStride);
        }
        pcVar20 = getenv("MEASURE_PERF");
        if (pcVar20 != (char *)0x0) {
          iVar19 = 0;
          lVar15 = std::chrono::_V2::system_clock::now();
          iVar21 = 1;
          do {
            iVar22 = 0;
            if (0 < iVar21) {
              iVar22 = iVar21;
            }
            while (bVar6 = iVar22 != 0, iVar22 = iVar22 + -1, bVar6) {
              ZXing::ReadBarcodes((ImageView *)(local_68 + 0x20),(ReaderOptions *)&image);
              std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
                        ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)(local_68 + 0x20))
              ;
            }
            iVar19 = iVar19 + iVar21;
            lVar16 = std::chrono::_V2::system_clock::now();
            uVar18 = lVar16 - lVar15;
            iVar22 = iVar21 * 10;
            if (99999999 < (long)uVar18) {
              iVar22 = iVar21;
            }
            if (iVar21 < 1000) {
              iVar21 = iVar22;
            }
          } while ((long)uVar18 < 1000000000);
          printf("time: %5.2f ms per frame\n",(double)(uVar18 / 1000000) / (double)iVar19);
        }
        std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector(&barcodes);
      }
      std::unique_ptr<unsigned_char,_void_(*)(void_*)>::~unique_ptr(&buffer);
      __lhs = __lhs + 1;
      uVar5 = local_23c;
    } while (data != (stbi_uc *)0x0);
  }
  local_23c = uVar5;
  std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector(&allBarcodes);
  CLI::~CLI(&cli);
  return local_23c;
}

Assistant:

int main(int argc, char* argv[])
{
	ReaderOptions options;
	CLI cli;
	Barcodes allBarcodes;
	int ret = 0;

	options.setTextMode(TextMode::HRI);
	options.setEanAddOnSymbol(EanAddOnSymbol::Read);

	if (!ParseOptions(argc, argv, options, cli)) {
		PrintUsage(argv[0]);
		return -1;
	}

	std::cout.setf(std::ios::boolalpha);

	for (const auto& filePath : cli.filePaths) {
		int width, height, channels;
		std::unique_ptr<stbi_uc, void (*)(void*)> buffer(stbi_load(filePath.c_str(), &width, &height, &channels, cli.forceChannels),
														 stbi_image_free);
		if (buffer == nullptr) {
			std::cerr << "Failed to read image: " << filePath << " (" << stbi_failure_reason() << ")" << "\n";
			return -1;
		}
		channels = cli.forceChannels ? cli.forceChannels : channels;

		auto ImageFormatFromChannels = std::array{ImageFormat::None, ImageFormat::Lum, ImageFormat::LumA, ImageFormat::RGB, ImageFormat::RGBA};
		ImageView image{buffer.get(), width, height, ImageFormatFromChannels.at(channels)};
		auto barcodes = ReadBarcodes(image.rotated(cli.rotate), options);

		// if we did not find anything, insert a dummy to produce some output for each file
		if (barcodes.empty())
			barcodes.emplace_back();

		allBarcodes.insert(allBarcodes.end(), barcodes.begin(), barcodes.end());
		if (filePath == cli.filePaths.back()) {
			auto merged = MergeStructuredAppendSequences(allBarcodes);
			// report all merged sequences as part of the last file to make the logic not overly complicated here
			barcodes.insert(barcodes.end(), std::make_move_iterator(merged.begin()), std::make_move_iterator(merged.end()));
		}

		for (auto&& barcode : barcodes) {

			if (!cli.outPath.empty())
				drawRect(image, barcode.position(), bool(barcode.error()));

			ret |= static_cast<int>(barcode.error().type());

			if (cli.bytesOnly) {
				std::cout.write(reinterpret_cast<const char*>(barcode.bytes().data()), barcode.bytes().size());
				continue;
			}

			if (cli.oneLine) {
				std::cout << filePath << " " << ToString(barcode.format());
				if (barcode.isValid())
					std::cout << " \"" << barcode.text(TextMode::Escaped) << "\"";
				else if (barcode.error())
					std::cout << " " << ToString(barcode.error());
				std::cout << "\n";
				continue;
			}

			if (cli.filePaths.size() > 1 || barcodes.size() > 1) {
				static bool firstFile = true;
				if (!firstFile)
					std::cout << "\n";
				if (cli.filePaths.size() > 1)
					std::cout << "File:       " << filePath << "\n";
				firstFile = false;
			}

			if (barcode.format() == BarcodeFormat::None) {
				std::cout << "No barcode found\n";
				continue;
			}

			std::cout << "Text:       \"" << barcode.text() << "\"\n"
					  << "Bytes:      " << ToHex(options.textMode() == TextMode::ECI ? barcode.bytesECI() : barcode.bytes()) << "\n"
					  << "Format:     " << ToString(barcode.format()) << "\n"
					  << "Identifier: " << barcode.symbologyIdentifier() << "\n"
					  << "Content:    " << ToString(barcode.contentType()) << "\n"
					  << "HasECI:     " << barcode.hasECI() << "\n"
					  << "Position:   " << ToString(barcode.position()) << "\n"
					  << "Rotation:   " << barcode.orientation() << " deg\n"
					  << "IsMirrored: " << barcode.isMirrored() << "\n"
					  << "IsInverted: " << barcode.isInverted() << "\n";

			auto printOptional = [](const char* key, const std::string& v) {
				if (!v.empty())
					std::cout << key << v << "\n";
			};

			printOptional("EC Level:   ", barcode.ecLevel());
			printOptional("Version:    ", barcode.version());
			printOptional("Error:      ", ToString(barcode.error()));

			if (barcode.lineCount())
				std::cout << "Lines:      " << barcode.lineCount() << "\n";

			if ((BarcodeFormat::EAN13 | BarcodeFormat::EAN8 | BarcodeFormat::UPCA | BarcodeFormat::UPCE)
					.testFlag(barcode.format())) {
				printOptional("Country:    ", GTIN::LookupCountryIdentifier(barcode.text(), barcode.format()));
				printOptional("Add-On:     ", GTIN::EanAddOn(barcode));
				printOptional("Price:      ", GTIN::Price(GTIN::EanAddOn(barcode)));
				printOptional("Issue #:    ", GTIN::IssueNr(GTIN::EanAddOn(barcode)));
			} else if (barcode.format() == BarcodeFormat::ITF && Size(barcode.bytes()) == 14) {
				printOptional("Country:    ", GTIN::LookupCountryIdentifier(barcode.text(), barcode.format()));
			}

			if (barcode.isPartOfSequence())
				std::cout << "Structured Append: symbol " << barcode.sequenceIndex() + 1 << " of "
						  << barcode.sequenceSize() << " (parity/id: '" << barcode.sequenceId() << "')\n";
			else if (barcode.sequenceSize() > 0)
				std::cout << "Structured Append: merged result from " << barcode.sequenceSize() << " symbols (parity/id: '"
						  << barcode.sequenceId() << "')\n";

			if (barcode.readerInit())
				std::cout << "Reader Initialisation/Programming\n";

#ifdef ZXING_EXPERIMENTAL_API
			if (cli.showSymbol && barcode.symbol().data())
				std::cout << "Symbol:\n" << WriteBarcodeToUtf8(barcode);
#endif
		}

		if (Size(cli.filePaths) == 1 && !cli.outPath.empty())
			stbi_write_png(cli.outPath.c_str(), image.width(), image.height(), 3, image.data(), image.rowStride());

#ifdef NDEBUG
		if (getenv("MEASURE_PERF")) {
			auto startTime = std::chrono::high_resolution_clock::now();
			auto duration = startTime - startTime;
			int N = 0;
			int blockSize = 1;
			do {
				for (int i = 0; i < blockSize; ++i)
					ReadBarcodes(image, options);
				N += blockSize;
				duration = std::chrono::high_resolution_clock::now() - startTime;
				if (blockSize < 1000 && duration < std::chrono::milliseconds(100))
					blockSize *= 10;
			} while (duration < std::chrono::seconds(1));
			printf("time: %5.2f ms per frame\n", double(std::chrono::duration_cast<std::chrono::milliseconds>(duration).count()) / N);
		}
#endif
	}

	return ret;
}